

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O0

double inform_shannon_pcmi(inform_dist *joint,inform_dist *marginal_xz,inform_dist *marginal_yz,
                          inform_dist *marginal_z,size_t event_joint,size_t event_marginal_xz,
                          size_t event_marginal_yz,size_t event_marginal_z,double base)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double base_local;
  size_t event_marginal_xz_local;
  size_t event_joint_local;
  inform_dist *marginal_z_local;
  inform_dist *marginal_yz_local;
  inform_dist *marginal_xz_local;
  inform_dist *joint_local;
  
  dVar1 = inform_shannon_si(marginal_xz,event_marginal_xz,base);
  dVar2 = inform_shannon_si(marginal_yz,event_marginal_yz,base);
  dVar3 = inform_shannon_si(joint,event_joint,base);
  dVar4 = inform_shannon_si(marginal_z,event_marginal_z,base);
  return ((dVar1 + dVar2) - dVar3) - dVar4;
}

Assistant:

double inform_shannon_pcmi(inform_dist const *joint,
    inform_dist const *marginal_xz, inform_dist const *marginal_yz,
    inform_dist const *marginal_z, size_t event_joint,
    size_t event_marginal_xz, size_t event_marginal_yz,
    size_t event_marginal_z, double base)
{
    return inform_shannon_si(marginal_xz, event_marginal_xz, base) +
        inform_shannon_si(marginal_yz, event_marginal_yz, base) -
        inform_shannon_si(joint, event_joint, base) -
        inform_shannon_si(marginal_z, event_marginal_z, base);
}